

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qflickgesture.cpp
# Opt level: O2

Result __thiscall
QFlickGestureRecognizer::recognize
          (QFlickGestureRecognizer *this,QGesture *state,QObject *watched,QEvent *event)

{
  QScroller **ppQVar1;
  ushort uVar2;
  short sVar3;
  long lVar4;
  QScroller *this_00;
  long lVar5;
  QScroller *this_01;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  QRegion QVar10;
  undefined8 uVar11;
  char cVar12;
  QFlagsStorage<Qt::MouseButton> eventButtons;
  QFlagsStorage<Qt::MouseButton> QVar13;
  int iVar14;
  MouseButton MVar15;
  State SVar16;
  State SVar17;
  State SVar18;
  QGraphicsObject *pQVar19;
  PressDelayHandler *pPVar20;
  QPoint QVar21;
  QWidget *pQVar22;
  QObject *pQVar23;
  QGraphicsScene *this_02;
  QSize QVar24;
  qint64 timestamp;
  QScroller **ppQVar25;
  QFlagsStorage<QGestureRecognizer::ResultFlag> QVar26;
  uint uVar27;
  QEvent *pQVar28;
  long lVar29;
  QEvent *this_03;
  Input input;
  long lVar30;
  uint uVar31;
  QEvent *this_04;
  QGraphicsItem *this_05;
  long in_FS_OFFSET;
  bool bVar32;
  bool bVar33;
  double in_XMM1_Qa;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  QPointF QVar38;
  QFlagsStorage<Qt::KeyboardModifier> local_1b8;
  double local_188;
  QPoint local_100;
  QPoint local_f8;
  QArrayDataPointer<QPoint> local_f0;
  QArrayDataPointer<QPoint> local_d8;
  QRegion local_c0;
  QArrayDataPointer<QPointF> local_b8;
  QRegion scrollerRegion;
  QArrayDataPointer<QScroller_*> local_98;
  QPointF local_78;
  QPoint local_60;
  undefined1 local_58 [12];
  Representation RStack_4c;
  undefined8 local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  cVar12 = QElapsedTimer::isValid();
  if (cVar12 == '\0') {
    QElapsedTimer::start();
  }
  lVar4 = *(long *)&state->field_0x8;
  this_00 = *(QScroller **)(lVar4 + 0xb8);
  QVar26.i = 1;
  if (this_00 == (QScroller *)0x0) goto LAB_005d9101;
  lVar29 = *(long *)(lVar4 + 0xa8);
  if (lVar29 == 0) {
    lVar30 = 0;
LAB_005d85e6:
    pQVar23 = (QObject *)0x0;
  }
  else {
    if ((*(int *)(lVar29 + 4) == 0) || (lVar5 = *(long *)(lVar4 + 0xb0), lVar5 == 0)) {
      lVar30 = 0;
    }
    else {
      lVar30 = 0;
      if ((*(byte *)(*(long *)(lVar5 + 8) + 0x30) & 1) != 0) {
        lVar30 = lVar5;
      }
    }
    if (*(int *)(lVar29 + 4) == 0) goto LAB_005d85e6;
    pQVar23 = *(QObject **)(lVar4 + 0xb0);
  }
  pQVar19 = QtPrivate::qobject_cast_helper<QGraphicsObject*,QObject>(pQVar23);
  pPVar20 = PressDelayHandler::instance();
  if (pPVar20->sendingEvent != false) goto LAB_005d9101;
  local_60.xp.m_i = 0;
  local_60.yp.m_i = 0;
  uVar2 = *(ushort *)(event + 8);
  if (uVar2 - 0x9b < 3) {
    if (pQVar19 != (QGraphicsObject *)0x0) {
      if (this->button == NoButton) goto LAB_005d8772;
      local_1b8.i = (Int)QGraphicsSceneMouseEvent::modifiers((QGraphicsSceneMouseEvent *)event);
      eventButtons.i = (Int)QGraphicsSceneMouseEvent::buttons((QGraphicsSceneMouseEvent *)event);
      local_60 = QGraphicsSceneMouseEvent::screenPos((QGraphicsSceneMouseEvent *)event);
      pQVar28 = (QEvent *)0x0;
      this_04 = event;
      goto LAB_005d8787;
    }
  }
  else {
    if (uVar2 - 0xc2 < 3) {
      if (this->button != NoButton) goto LAB_005d8772;
      local_1b8.i = *(Int *)(event + 0x20);
      pQVar28 = event;
      if (*(long *)(event + 0x38) != 0) {
        local_58._0_8_ = QEventPoint::globalPosition();
        stack0xffffffffffffffb0 = in_XMM1_Qa;
        local_60 = QPointF::toPoint((QPointF *)local_58);
      }
LAB_005d8784:
      eventButtons.i = 0;
      this_04 = (QEvent *)0x0;
LAB_005d8787:
      this_03 = (QEvent *)0x0;
    }
    else {
      if (1 < uVar2 - 2) {
        if (uVar2 == 4) {
          SVar16 = QScroller::state(this_00);
        }
        else {
          if (uVar2 != 0x1f) {
            if (uVar2 != 5) goto LAB_005d8772;
            goto LAB_005d8654;
          }
          QVar26.i = 0x101;
          if (*(char *)(lVar4 + 0xc4) != '\0') goto LAB_005d9101;
          SVar16 = QScroller::state(this_00);
        }
        QVar26.i = 0x101;
        if (SVar16 != Inactive) goto LAB_005d9101;
LAB_005d8772:
        local_1b8.i = 0;
        pQVar28 = (QEvent *)0x0;
        goto LAB_005d8784;
      }
LAB_005d8654:
      if (lVar30 == 0) goto LAB_005d90fe;
      if (this->button == NoButton) goto LAB_005d8772;
      local_1b8.i = *(Int *)(event + 0x20);
      eventButtons.i = *(Int *)(event + 0x44);
      _local_58 = (undefined1  [16])QSinglePointEvent::globalPosition((QSinglePointEvent *)event);
      in_XMM1_Qa = local_58._8_8_;
      local_60 = QPointF::toPoint((QPointF *)local_58);
      pQVar28 = (QEvent *)0x0;
      this_04 = (QEvent *)0x0;
      this_03 = event;
    }
    bVar32 = this_04 != (QEvent *)0x0 || this_03 != (QEvent *)0x0;
    if ((this_04 != (QEvent *)0x0 || this_03 != (QEvent *)0x0) || pQVar28 != (QEvent *)0x0) {
      local_78 = (QPointF)ZEXT816(0);
      sVar3 = *(short *)(event + 8);
      if (sVar3 != 0xc4) {
        input = 0;
        if (sVar3 == 3) {
          if ((this_03 != (QEvent *)0x0) &&
             (*(MouseButton *)((QSinglePointEvent *)this_03 + 0x40) == this->button)) {
            _local_58 = (undefined1  [16])
                        QSinglePointEvent::globalPosition((QSinglePointEvent *)this_03);
            QVar21 = QPointF::toPoint((QPointF *)local_58);
            local_78.xp = (qreal)QVar21.xp.m_i.m_i;
            local_78.yp = (qreal)QVar21.yp.m_i.m_i;
LAB_005d8d99:
            input = InputRelease;
          }
        }
        else if (sVar3 == 5) {
          if ((this_03 != (QEvent *)0x0) &&
             (*(MouseButton *)((QSinglePointEvent *)this_03 + 0x44) == this->button)) {
            _local_58 = (undefined1  [16])
                        QSinglePointEvent::globalPosition((QSinglePointEvent *)this_03);
            QVar21 = QPointF::toPoint((QPointF *)local_58);
            local_78.xp = (qreal)QVar21.xp.m_i.m_i;
            local_78.yp = (qreal)QVar21.yp.m_i.m_i;
LAB_005d8d4f:
            input = InputMove;
          }
        }
        else if (sVar3 == 0x9b) {
          if ((this_04 != (QEvent *)0x0) &&
             (QVar13.i = (Int)QGraphicsSceneMouseEvent::buttons((QGraphicsSceneMouseEvent *)this_04)
             , QVar13.i == this->button)) {
            QVar38 = QGraphicsSceneMouseEvent::scenePos((QGraphicsSceneMouseEvent *)this_04);
            local_78.yp = QVar38.yp;
            local_78.xp = QVar38.xp;
            goto LAB_005d8d4f;
          }
        }
        else if (sVar3 == 0x9c) {
          if (this_04 != (QEvent *)0x0) {
            MVar15 = QGraphicsSceneMouseEvent::button((QGraphicsSceneMouseEvent *)this_04);
            if ((MVar15 != this->button) ||
               (QVar13.i = (Int)QGraphicsSceneMouseEvent::buttons
                                          ((QGraphicsSceneMouseEvent *)this_04),
               QVar13.i != this->button)) {
LAB_005d8db0:
              QScroller::stop(this_00);
              QVar26.i = 0x10;
              goto LAB_005d9101;
            }
            QVar38 = QGraphicsSceneMouseEvent::scenePos((QGraphicsSceneMouseEvent *)this_04);
            local_78.yp = QVar38.yp;
            local_78.xp = QVar38.xp;
LAB_005d88b8:
            goto LAB_005d89f3;
          }
        }
        else if (sVar3 == 0x9d) {
          if ((this_04 != (QEvent *)0x0) &&
             (MVar15 = QGraphicsSceneMouseEvent::button((QGraphicsSceneMouseEvent *)this_04),
             MVar15 == this->button)) {
            QVar38 = QGraphicsSceneMouseEvent::scenePos((QGraphicsSceneMouseEvent *)this_04);
            local_78.yp = QVar38.yp;
            local_78.xp = QVar38.xp;
            goto LAB_005d8d99;
          }
        }
        else {
          if (sVar3 == 0xc2) {
            input = InputPress;
            bVar33 = true;
            goto LAB_005d88de;
          }
          if (sVar3 == 0xc3) {
            input = InputMove;
            goto LAB_005d88d1;
          }
          if ((sVar3 == 2) && (this_03 != (QEvent *)0x0)) {
            if ((*(MouseButton *)((QSinglePointEvent *)this_03 + 0x40) == this->button) &&
               (*(MouseButton *)((QSinglePointEvent *)this_03 + 0x44) ==
                *(MouseButton *)((QSinglePointEvent *)this_03 + 0x40))) {
              _local_58 = (undefined1  [16])
                          QSinglePointEvent::globalPosition((QSinglePointEvent *)this_03);
              QVar21 = QPointF::toPoint((QPointF *)local_58);
              local_78.xp = (qreal)QVar21.xp.m_i.m_i;
              local_78.yp = (qreal)QVar21.yp.m_i.m_i;
              goto LAB_005d88b8;
            }
            goto LAB_005d8db0;
          }
        }
LAB_005d8dd2:
        SVar16 = QScroller::state(this_00);
        SVar17 = QScroller::state(this_00);
        if (input != 0) {
          lVar29 = *(long *)(lVar4 + 0xa8);
          if (lVar29 == 0) {
LAB_005d8e36:
            pQVar23 = (QObject *)0x0;
LAB_005d8e38:
            pQVar19 = QtPrivate::qobject_cast_helper<QGraphicsObject*,QObject>(pQVar23);
            if (pQVar19 != (QGraphicsObject *)0x0) {
              local_78 = QGraphicsItem::mapFromScene(&pQVar19->super_QGraphicsItem,&local_78);
            }
          }
          else {
            if (((*(int *)(lVar29 + 4) == 0) ||
                (pQVar22 = *(QWidget **)(lVar4 + 0xb0), pQVar22 == (QWidget *)0x0)) ||
               ((*(byte *)(*(long *)&pQVar22->field_0x8 + 0x30) & 1) == 0)) {
              if (*(int *)(lVar29 + 4) == 0) goto LAB_005d8e36;
              pQVar23 = *(QObject **)(lVar4 + 0xb0);
              goto LAB_005d8e38;
            }
            QVar21 = QPointF::toPoint(&local_78);
            local_58._0_8_ = QVar21;
            QVar21 = QWidget::mapFromGlobal(pQVar22,(QPoint *)local_58);
            local_78.yp = (double)QVar21.yp.m_i.m_i;
            local_78.xp = (double)QVar21.xp.m_i.m_i;
          }
          timestamp = QElapsedTimer::elapsed();
          QScroller::handleInput(this_00,input,&local_78,timestamp);
        }
        SVar18 = QScroller::state(this_00);
        bVar33 = true;
        if (SVar18 != Dragging) {
          SVar18 = QScroller::state(this_00);
          bVar33 = SVar18 == Scrolling;
        }
        if (bVar32) {
          if (((SVar16 == Dragging) || (SVar17 == Scrolling)) || (bVar33 != true)) {
            if ((SVar17 == Scrolling) &&
               ((SVar18 = QScroller::state(this_00), SVar18 == Dragging ||
                (SVar18 = QScroller::state(this_00), SVar18 == Inactive)))) {
              pPVar20 = PressDelayHandler::instance();
              PressDelayHandler::scrollerWasIntercepted(pPVar20);
            }
          }
          else {
            pPVar20 = PressDelayHandler::instance();
            PressDelayHandler::scrollerBecameActive
                      (pPVar20,(KeyboardModifiers)local_1b8.i,(MouseButtons)eventButtons.i);
          }
        }
        uVar27 = (uint)(byte)(bVar32 & bVar33) << 8;
        if (input == 0) {
LAB_005d903e:
          QVar26.i = uVar27 | 1;
          goto LAB_005d9101;
        }
        sVar3 = *(short *)(event + 8);
        if (sVar3 == 2) {
LAB_005d8f89:
          SVar16 = QScroller::state(this_00);
          if (SVar16 == Pressed) {
            QScroller::scrollerProperties((QScroller *)&local_98);
            QScrollerProperties::scrollMetric
                      ((QVariant *)local_58,(QScrollerProperties *)&local_98,MousePressEventDelay);
            dVar6 = (double)::QVariant::toReal((bool *)local_58);
            ::QVariant::~QVariant((QVariant *)local_58);
            QScrollerProperties::~QScrollerProperties((QScrollerProperties *)&local_98);
            if (0 < (int)(dVar6 * 1000.0)) {
              pPVar20 = PressDelayHandler::instance();
              PressDelayHandler::pressed(pPVar20,event,(int)(dVar6 * 1000.0));
              event[0xc] = (QEvent)0x1;
              uVar27 = 0x100;
            }
          }
LAB_005d900f:
          local_58._8_4_ = SUB84((double)local_60.yp.m_i.m_i,0);
          local_58._0_8_ = (double)local_60.xp.m_i.m_i;
          RStack_4c.m_i = (int)((ulong)(double)local_60.yp.m_i.m_i >> 0x20);
          QGesture::setHotSpot(state,(QPointF *)local_58);
          QVar26.i = uVar27 + (uint)bVar33 * 2 + 2;
          goto LAB_005d9101;
        }
        uVar31 = uVar27;
        if (sVar3 == 3) {
LAB_005d906b:
          pPVar20 = PressDelayHandler::instance();
          bVar32 = PressDelayHandler::released
                             (pPVar20,event,SVar16 == Dragging || SVar17 == Scrolling,bVar33);
          if (bVar32) {
            uVar31 = 0x100;
          }
LAB_005d909e:
          uVar27 = (uint)(bVar33 ^ 1) * 8 + 8;
        }
        else {
          if ((sVar3 == 5) || (sVar3 == 0x9b)) {
            pPVar20 = PressDelayHandler::instance();
            uVar31 = 0x100;
            if ((pPVar20->pressDelayEvent).d == (QMouseEvent *)0x0) {
              uVar31 = uVar27;
            }
          }
          else {
            if (sVar3 == 0xc4) goto LAB_005d909e;
            if (sVar3 == 0x9d) goto LAB_005d906b;
            if (sVar3 == 0xc2) goto LAB_005d900f;
            if (sVar3 != 0xc3) {
              if (sVar3 != 0x9c) goto LAB_005d903e;
              goto LAB_005d8f89;
            }
          }
          uVar27 = (uint)bVar33 + (uint)bVar33 * 2 + 1;
        }
        QVar26.i = uVar27 | uVar31;
        goto LAB_005d9101;
      }
      input = InputRelease;
LAB_005d88d1:
      bVar33 = false;
LAB_005d88de:
      QPointerEvent::pointingDevice();
      iVar14 = QInputDevice::type();
      if (iVar14 == 4) {
        if (*(long *)(pQVar28 + 0x38) == 2) {
          local_188 = (double)QEventPoint::scenePressPosition();
          dVar34 = in_XMM1_Qa;
          dVar9 = (double)QEventPoint::scenePosition();
          dVar35 = dVar34;
          dVar8 = (double)QEventPoint::scenePressPosition();
          dVar36 = dVar35;
          dVar7 = (double)QEventPoint::scenePosition();
          dVar37 = dVar36;
          dVar6 = (double)QEventPoint::scenePressPosition();
          local_188 = local_188 + ((dVar7 - dVar6) + (dVar9 - dVar8)) * 0.5;
          in_XMM1_Qa = in_XMM1_Qa + ((dVar36 - dVar37) + (dVar34 - dVar35)) * 0.5;
LAB_005d89e1:
          local_78.yp._0_4_ = SUB84(in_XMM1_Qa,0);
          local_78.xp = local_188;
          local_78.yp._4_4_ = (int)((ulong)in_XMM1_Qa >> 0x20);
          if (bVar33) {
LAB_005d89f3:
            local_98.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
            local_98.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
            local_98.ptr = (QScroller **)&DAT_aaaaaaaaaaaaaaaa;
            QScroller::activeScrollers();
            ppQVar1 = local_98.ptr + local_98.size;
            for (ppQVar25 = local_98.ptr; ppQVar25 != ppQVar1; ppQVar25 = ppQVar25 + 1) {
              this_01 = *ppQVar25;
              if (this_01 != this_00) {
                scrollerRegion.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
                QRegion::QRegion(&scrollerRegion);
                pQVar22 = (QWidget *)QScroller::target(this_01);
                if ((pQVar22 == (QWidget *)0x0) ||
                   ((*(byte *)(*(long *)&pQVar22->field_0x8 + 0x30) & 1) == 0)) {
                  pQVar23 = QScroller::target(this_01);
                  pQVar19 = QtPrivate::qobject_cast_helper<QGraphicsObject*,QObject>(pQVar23);
                  if (pQVar19 != (QGraphicsObject *)0x0) {
                    this_05 = &pQVar19->super_QGraphicsItem;
                    this_02 = (QGraphicsScene *)QGraphicsItem::scene(this_05);
                    if (this_02 != (QGraphicsScene *)0x0) {
                      local_b8.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
                      local_b8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
                      local_b8.ptr._0_4_ = 0xaaaaaaaa;
                      local_b8.ptr._4_4_ = 0xaaaaaaaa;
                      (*this_05->_vptr_QGraphicsItem[3])((QRectF *)local_58,this_05);
                      QGraphicsItem::mapToScene((QPolygonF *)&local_b8,this_05,(QRectF *)local_58);
                      local_48 = &DAT_aaaaaaaaaaaaaaaa;
                      stack0xffffffffffffffb0 = &DAT_aaaaaaaaaaaaaaaa;
                      local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
                      QGraphicsScene::views((QList<QGraphicsView_*> *)local_58,this_02);
                      uVar11 = stack0xffffffffffffffb0;
                      lVar30 = local_48 << 3;
                      for (lVar29 = 0; lVar30 != lVar29; lVar29 = lVar29 + 8) {
                        pQVar22 = *(QWidget **)(uVar11 + lVar29);
                        QGraphicsView::mapFromScene
                                  ((QPolygon *)&local_f0,(QGraphicsView *)pQVar22,
                                   (QPolygonF *)&local_b8);
                        local_100.xp.m_i = 0;
                        local_100.yp.m_i = 0;
                        local_f8 = QWidget::mapToGlobal(pQVar22,&local_100);
                        QPolygon::translated((QPolygon *)&local_d8,(QPolygon *)&local_f0,&local_f8);
                        QRegion::QRegion(&local_c0,(QPolygon *)&local_d8,OddEvenFill);
                        QRegion::operator|=(&scrollerRegion,&local_c0);
                        QRegion::~QRegion(&local_c0);
                        QArrayDataPointer<QPoint>::~QArrayDataPointer(&local_d8);
                        QArrayDataPointer<QPoint>::~QArrayDataPointer(&local_f0);
                      }
                      QArrayDataPointer<QGraphicsView_*>::~QArrayDataPointer
                                ((QArrayDataPointer<QGraphicsView_*> *)local_58);
                      QArrayDataPointer<QPointF>::~QArrayDataPointer(&local_b8);
                    }
                  }
                }
                else {
                  local_d8.d = (Data *)0x0;
                  QVar21 = QWidget::mapToGlobal(pQVar22,(QPoint *)&local_d8);
                  QVar24 = QWidget::size(pQVar22);
                  local_58._8_4_ = QVar21.xp.m_i.m_i + QVar24.wd.m_i.m_i + -1;
                  local_58._0_8_ = QVar21;
                  RStack_4c.m_i = QVar24.ht.m_i.m_i + QVar21.yp.m_i.m_i + -1;
                  QRegion::QRegion((QRegion *)&local_b8,(QRect *)local_58,Rectangle);
                  QVar10 = scrollerRegion;
                  scrollerRegion.d = (QRegionData *)local_b8.d;
                  local_b8.d = (Data *)QVar10.d;
                  QRegion::~QRegion((QRegion *)&local_b8);
                }
                cVar12 = QRegion::contains((QPoint *)&scrollerRegion);
                QRegion::~QRegion(&scrollerRegion);
                if (cVar12 != '\0') {
                  QArrayDataPointer<QScroller_*>::~QArrayDataPointer(&local_98);
                  goto LAB_005d90fe;
                }
              }
            }
            QArrayDataPointer<QScroller_*>::~QArrayDataPointer(&local_98);
            input = InputPress;
          }
          goto LAB_005d8dd2;
        }
      }
      else if (*(long *)(pQVar28 + 0x38) == 1) {
        local_188 = (double)QEventPoint::scenePosition();
        goto LAB_005d89e1;
      }
    }
  }
LAB_005d90fe:
  QVar26.i = 1;
LAB_005d9101:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (QFlagsStorageHelper<QGestureRecognizer::ResultFlag,_4>)
         (QFlagsStorageHelper<QGestureRecognizer::ResultFlag,_4>)QVar26.i;
}

Assistant:

QGestureRecognizer::Result QFlickGestureRecognizer::recognize(QGesture *state,
                                                              QObject *watched,
                                                              QEvent *event)
{
    Q_UNUSED(watched);

    Q_CONSTINIT static QElapsedTimer monotonicTimer;
    if (!monotonicTimer.isValid())
        monotonicTimer.start();

    QFlickGesture *q = static_cast<QFlickGesture *>(state);
    QFlickGesturePrivate *d = q->d_func();

    QScroller *scroller = d->receiverScroller;
    if (!scroller)
        return Ignore; // nothing to do without a scroller?

    QWidget *receiverWidget = qobject_cast<QWidget *>(d->receiver);
#if QT_CONFIG(graphicsview)
    QGraphicsObject *receiverGraphicsObject = qobject_cast<QGraphicsObject *>(d->receiver);
#endif

    // this is only set for events that we inject into the event loop via sendEvent()
    if (PressDelayHandler::instance()->shouldEventBeIgnored(event)) {
        //qFGDebug() << state << "QFG: ignored event: " << event->type();
        return Ignore;
    }

    const QMouseEvent *me = nullptr;
#if QT_CONFIG(graphicsview)
    const QGraphicsSceneMouseEvent *gsme = nullptr;
#endif
    const QTouchEvent *te = nullptr;
    QPoint globalPos;

    // qFGDebug() << "FlickGesture "<<state<<"watched:"<<watched<<"receiver"<<d->receiver<<"event"<<event->type()<<"button"<<button;

    Qt::KeyboardModifiers keyboardModifiers = Qt::NoModifier;
    Qt::MouseButtons mouseButtons = Qt::NoButton;
    switch (event->type()) {
    case QEvent::MouseButtonPress:
    case QEvent::MouseButtonRelease:
    case QEvent::MouseMove:
        if (!receiverWidget)
            return Ignore;
        if (button != Qt::NoButton) {
            me = static_cast<const QMouseEvent *>(event);
            keyboardModifiers = me->modifiers();
            mouseButtons = me->buttons();
            globalPos = me->globalPosition().toPoint();
        }
        break;
#if QT_CONFIG(graphicsview)
    case QEvent::GraphicsSceneMousePress:
    case QEvent::GraphicsSceneMouseRelease:
    case QEvent::GraphicsSceneMouseMove:
        if (!receiverGraphicsObject)
            return Ignore;
        if (button != Qt::NoButton) {
            gsme = static_cast<const QGraphicsSceneMouseEvent *>(event);
            keyboardModifiers = gsme->modifiers();
            mouseButtons = gsme->buttons();
            globalPos = gsme->screenPos();
        }
        break;
#endif
    case QEvent::TouchBegin:
    case QEvent::TouchEnd:
    case QEvent::TouchUpdate:
        if (button == Qt::NoButton) {
            te = static_cast<const QTouchEvent *>(event);
            keyboardModifiers = te->modifiers();
            if (!te->points().isEmpty())
                globalPos = te->points().at(0).globalPosition().toPoint();
        }
        break;

    // consume all wheel events if the scroller is active
    case QEvent::Wheel:
        if (d->macIgnoreWheel || (scroller->state() != QScroller::Inactive))
            return Ignore | ConsumeEventHint;
        break;

    // consume all dbl click events if the scroller is active
    case QEvent::MouseButtonDblClick:
        if (scroller->state() != QScroller::Inactive)
            return Ignore | ConsumeEventHint;
        break;

    default:
        break;
    }

    if (!me
#if QT_CONFIG(graphicsview)
        && !gsme
#endif
        && !te) // Neither mouse nor touch
        return Ignore;

    // get the current pointer position in local coordinates.
    QPointF point;
    QScroller::Input inputType = (QScroller::Input) 0;

    switch (event->type()) {
    case QEvent::MouseButtonPress:
        if (me && me->button() == button && me->buttons() == button) {
            point = me->globalPosition().toPoint();
            inputType = QScroller::InputPress;
        } else if (me) {
            scroller->stop();
            return CancelGesture;
        }
        break;
    case QEvent::MouseButtonRelease:
        if (me && me->button() == button) {
            point = me->globalPosition().toPoint();
            inputType = QScroller::InputRelease;
        }
        break;
    case QEvent::MouseMove:
        if (me && me->buttons() == button) {
            point = me->globalPosition().toPoint();
            inputType = QScroller::InputMove;
        }
        break;

#if QT_CONFIG(graphicsview)
    case QEvent::GraphicsSceneMousePress:
        if (gsme && gsme->button() == button && gsme->buttons() == button) {
            point = gsme->scenePos();
            inputType = QScroller::InputPress;
        } else if (gsme) {
            scroller->stop();
            return CancelGesture;
        }
        break;
    case QEvent::GraphicsSceneMouseRelease:
        if (gsme && gsme->button() == button) {
            point = gsme->scenePos();
            inputType = QScroller::InputRelease;
        }
        break;
    case QEvent::GraphicsSceneMouseMove:
        if (gsme && gsme->buttons() == button) {
            point = gsme->scenePos();
            inputType = QScroller::InputMove;
        }
        break;
#endif

    case QEvent::TouchBegin:
        inputType = QScroller::InputPress;
        Q_FALLTHROUGH();
    case QEvent::TouchEnd:
        if (!inputType)
            inputType = QScroller::InputRelease;
        Q_FALLTHROUGH();
    case QEvent::TouchUpdate:
        if (!inputType)
            inputType = QScroller::InputMove;

        if (te->pointingDevice()->type() == QInputDevice::DeviceType::TouchPad) {
            if (te->points().size() != 2)  // 2 fingers on pad
                return Ignore;

            point = te->points().at(0).scenePressPosition() +
                    ((te->points().at(0).scenePosition() - te->points().at(0).scenePressPosition()) +
                     (te->points().at(1).scenePosition() - te->points().at(1).scenePressPosition())) / 2;
        } else { // TouchScreen
            if (te->points().size() != 1) // 1 finger on screen
                return Ignore;

            point = te->points().at(0).scenePosition();
        }
        break;

    default:
        break;
    }

    // Check for an active scroller at globalPos
    if (inputType == QScroller::InputPress) {
        const auto activeScrollers = QScroller::activeScrollers();
        for (QScroller *as : activeScrollers) {
            if (as != scroller) {
                QRegion scrollerRegion;

                if (QWidget *w = qobject_cast<QWidget *>(as->target())) {
                    scrollerRegion = QRect(w->mapToGlobal(QPoint(0, 0)), w->size());
#if QT_CONFIG(graphicsview)
                } else if (QGraphicsObject *go = qobject_cast<QGraphicsObject *>(as->target())) {
                    if (const auto *scene = go->scene()) {
                        const auto goBoundingRectMappedToScene = go->mapToScene(go->boundingRect());
                        const auto views = scene->views();
                        for (QGraphicsView *gv : views) {
                            scrollerRegion |= gv->mapFromScene(goBoundingRectMappedToScene)
                                              .translated(gv->mapToGlobal(QPoint(0, 0)));
                        }
                    }
#endif
                }
                // active scrollers always have priority
                if (scrollerRegion.contains(globalPos))
                    return Ignore;
            }
        }
    }

    bool scrollerWasDragging = (scroller->state() == QScroller::Dragging);
    bool scrollerWasScrolling = (scroller->state() == QScroller::Scrolling);

    if (inputType) {
        if (QWidget *w = qobject_cast<QWidget *>(d->receiver))
            point = w->mapFromGlobal(point.toPoint());
#if QT_CONFIG(graphicsview)
        else if (QGraphicsObject *go = qobject_cast<QGraphicsObject *>(d->receiver))
            point = go->mapFromScene(point);
#endif

        // inform the scroller about the new event
        scroller->handleInput(inputType, point, monotonicTimer.elapsed());
    }

    // depending on the scroller state return the gesture state
    Result result;
    bool scrollerIsActive = (scroller->state() == QScroller::Dragging ||
                             scroller->state() == QScroller::Scrolling);

    // Consume all mouse events while dragging or scrolling to avoid nasty
    // side effects with Qt's standard widgets.
    if ((me
#if QT_CONFIG(graphicsview)
         || gsme
#endif
         ) && scrollerIsActive)
        result |= ConsumeEventHint;

    // The only problem with this approach is that we consume the
    // MouseRelease when we start the scrolling with a flick gesture, so we
    // have to fake a MouseRelease "somewhere" to not mess with the internal
    // states of Qt's widgets (a QPushButton would stay in 'pressed' state
    // forever, if it doesn't receive a MouseRelease).
    if (me
#if QT_CONFIG(graphicsview)
        || gsme
#endif
        ) {
        if (!scrollerWasDragging && !scrollerWasScrolling && scrollerIsActive)
            PressDelayHandler::instance()->scrollerBecameActive(keyboardModifiers, mouseButtons);
        else if (scrollerWasScrolling && (scroller->state() == QScroller::Dragging || scroller->state() == QScroller::Inactive))
            PressDelayHandler::instance()->scrollerWasIntercepted();
    }

    if (!inputType) {
        result |= Ignore;
    } else {
        switch (event->type()) {
        case QEvent::MouseButtonPress:
#if QT_CONFIG(graphicsview)
        case QEvent::GraphicsSceneMousePress:
#endif
            if (scroller->state() == QScroller::Pressed) {
                int pressDelay = int(1000 * scroller->scrollerProperties().scrollMetric(QScrollerProperties::MousePressEventDelay).toReal());
                if (pressDelay > 0) {
                    result |= ConsumeEventHint;

                    PressDelayHandler::instance()->pressed(event, pressDelay);
                    event->accept();
                }
            }
            Q_FALLTHROUGH();
        case QEvent::TouchBegin:
            q->setHotSpot(globalPos);
            result |= scrollerIsActive ? TriggerGesture : MayBeGesture;
            break;

        case QEvent::MouseMove:
#if QT_CONFIG(graphicsview)
        case QEvent::GraphicsSceneMouseMove:
#endif
            if (PressDelayHandler::instance()->isDelaying())
                result |= ConsumeEventHint;
            Q_FALLTHROUGH();
        case QEvent::TouchUpdate:
            result |= scrollerIsActive ? TriggerGesture : Ignore;
            break;

#if QT_CONFIG(graphicsview)
        case QEvent::GraphicsSceneMouseRelease:
#endif
        case QEvent::MouseButtonRelease:
            if (PressDelayHandler::instance()->released(event, scrollerWasDragging || scrollerWasScrolling, scrollerIsActive))
                result |= ConsumeEventHint;
            Q_FALLTHROUGH();
        case QEvent::TouchEnd:
            result |= scrollerIsActive ? FinishGesture : CancelGesture;
            break;

        default:
            result |= Ignore;
            break;
        }
    }
    return result;
}